

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O1

QIcon * SynthWidget::getSynthDetailsIcon(bool visible)

{
  int iVar1;
  QIcon *pQVar2;
  QString local_28;
  
  if (getSynthDetailsIcon(bool)::SYNTH_DETAILS_VISIBLE == '\0') {
    iVar1 = __cxa_guard_acquire(&getSynthDetailsIcon(bool)::SYNTH_DETAILS_VISIBLE);
    if (iVar1 != 0) {
      QString::QString(&local_28,":/images/DetailsHide.gif");
      QIcon::QIcon((QIcon *)&getSynthDetailsIcon(bool)::SYNTH_DETAILS_VISIBLE,(QString *)&local_28);
      if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_28.d.d)->super_QArrayData,2,8);
        }
      }
      __cxa_atexit(QIcon::~QIcon,&getSynthDetailsIcon(bool)::SYNTH_DETAILS_VISIBLE,&__dso_handle);
      __cxa_guard_release(&getSynthDetailsIcon(bool)::SYNTH_DETAILS_VISIBLE);
    }
  }
  if (getSynthDetailsIcon(bool)::SYNTH_DETAILS_HIDDEN == '\0') {
    iVar1 = __cxa_guard_acquire(&getSynthDetailsIcon(bool)::SYNTH_DETAILS_HIDDEN);
    if (iVar1 != 0) {
      QString::QString(&local_28,":/images/Details.gif");
      QIcon::QIcon((QIcon *)&getSynthDetailsIcon(bool)::SYNTH_DETAILS_HIDDEN,(QString *)&local_28);
      if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_28.d.d)->super_QArrayData,2,8);
        }
      }
      __cxa_atexit(QIcon::~QIcon,&getSynthDetailsIcon(bool)::SYNTH_DETAILS_HIDDEN,&__dso_handle);
      __cxa_guard_release(&getSynthDetailsIcon(bool)::SYNTH_DETAILS_HIDDEN);
    }
  }
  pQVar2 = (QIcon *)&getSynthDetailsIcon(bool)::SYNTH_DETAILS_HIDDEN;
  if (visible) {
    pQVar2 = (QIcon *)&getSynthDetailsIcon(bool)::SYNTH_DETAILS_VISIBLE;
  }
  return pQVar2;
}

Assistant:

const QIcon &SynthWidget::getSynthDetailsIcon(bool visible) {
	static const QIcon SYNTH_DETAILS_VISIBLE(":/images/DetailsHide.gif");
	static const QIcon SYNTH_DETAILS_HIDDEN(":/images/Details.gif");

	return visible ? SYNTH_DETAILS_VISIBLE : SYNTH_DETAILS_HIDDEN;
}